

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

opj_bool tcd_init_v2(opj_tcd_v2_t *p_tcd,opj_image_t *p_image,opj_cp_v2_t *p_cp)

{
  OPJ_UINT32 OVar1;
  opj_tcd_tile_v2_t *poVar2;
  opj_tcd_tilecomp_v2_t *poVar3;
  opj_bool oVar4;
  
  p_tcd->image = p_image;
  p_tcd->cp = p_cp;
  poVar2 = (opj_tcd_tile_v2_t *)calloc(1,0x358);
  p_tcd->tcd_image->tiles = poVar2;
  oVar4 = 0;
  if (poVar2 != (opj_tcd_tile_v2_t *)0x0) {
    OVar1 = p_image->numcomps;
    poVar3 = (opj_tcd_tilecomp_v2_t *)calloc(1,(ulong)(OVar1 * 0x38));
    poVar2->comps = poVar3;
    oVar4 = 0;
    if (poVar3 != (opj_tcd_tilecomp_v2_t *)0x0) {
      poVar2->numcomps = OVar1;
      p_tcd->tp_pos = (p_cp->m_specific_param).m_enc.m_tp_pos;
      oVar4 = 1;
    }
  }
  return oVar4;
}

Assistant:

opj_bool tcd_init_v2(  opj_tcd_v2_t *p_tcd,
					   opj_image_t * p_image,
					   opj_cp_v2_t * p_cp )
{
	OPJ_UINT32 l_tile_comp_size;

	p_tcd->image = p_image;
	p_tcd->cp = p_cp;

	p_tcd->tcd_image->tiles = (opj_tcd_tile_v2_t *) opj_malloc(sizeof(opj_tcd_tile_v2_t));
	if (! p_tcd->tcd_image->tiles) {
		return OPJ_FALSE;
	}
	memset(p_tcd->tcd_image->tiles,0, sizeof(opj_tcd_tile_v2_t));

	l_tile_comp_size = p_image->numcomps * sizeof(opj_tcd_tilecomp_v2_t);
	p_tcd->tcd_image->tiles->comps = (opj_tcd_tilecomp_v2_t *) opj_malloc(l_tile_comp_size);
	if (! p_tcd->tcd_image->tiles->comps ) {
		return OPJ_FALSE;
	}
	memset( p_tcd->tcd_image->tiles->comps , 0 , l_tile_comp_size);

	p_tcd->tcd_image->tiles->numcomps = p_image->numcomps;
	p_tcd->tp_pos = p_cp->m_specific_param.m_enc.m_tp_pos;

	return OPJ_TRUE;
}